

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void op_http_stream_clear(OpusHTTPStream *_stream)

{
  OpusHTTPConn *_conn;
  
  _conn = _stream->lru_head;
  if (_conn != (OpusHTTPConn *)0x0) {
    do {
      op_http_conn_close(_stream,_conn,&_stream->lru_head,0);
      _conn = _stream->lru_head;
    } while (_conn != (OpusHTTPConn *)0x0);
  }
  if ((SSL_SESSION *)_stream->ssl_session != (SSL_SESSION *)0x0) {
    SSL_SESSION_free((SSL_SESSION *)_stream->ssl_session);
  }
  if ((SSL_CTX *)_stream->ssl_ctx != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)_stream->ssl_ctx);
  }
  free((_stream->response).buf);
  free((_stream->proxy_connect).buf);
  free((_stream->request).buf);
  if (_stream->connect_host != (_stream->url).host) {
    free(_stream->connect_host);
  }
  op_parsed_url_clear(&_stream->url);
  return;
}

Assistant:

static void op_http_stream_clear(OpusHTTPStream *_stream){
  while(_stream->lru_head!=NULL){
    op_http_conn_close(_stream,_stream->lru_head,&_stream->lru_head,0);
  }
  if(_stream->ssl_session!=NULL)SSL_SESSION_free(_stream->ssl_session);
  if(_stream->ssl_ctx!=NULL)SSL_CTX_free(_stream->ssl_ctx);
  op_sb_clear(&_stream->response);
  op_sb_clear(&_stream->proxy_connect);
  op_sb_clear(&_stream->request);
  if(_stream->connect_host!=_stream->url.host)_ogg_free(_stream->connect_host);
  op_parsed_url_clear(&_stream->url);
}